

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_internal.c
# Opt level: O0

void bench_sha256(void *arg,int iters)

{
  int in_ESI;
  secp256k1_sha256 sha;
  bench_inv *data;
  int i;
  size_t in_stack_ffffffffffffff80;
  uchar *in_stack_ffffffffffffff88;
  secp256k1_sha256 *in_stack_ffffffffffffff90;
  int local_10;
  
  for (local_10 = 0; local_10 < in_ESI; local_10 = local_10 + 1) {
    secp256k1_sha256_initialize((secp256k1_sha256 *)&stack0xffffffffffffff80);
    secp256k1_sha256_write
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    secp256k1_sha256_finalize(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  return;
}

Assistant:

static void bench_sha256(void* arg, int iters) {
    int i;
    bench_inv *data = (bench_inv*)arg;
    secp256k1_sha256 sha;

    for (i = 0; i < iters; i++) {
        secp256k1_sha256_initialize(&sha);
        secp256k1_sha256_write(&sha, data->data, 32);
        secp256k1_sha256_finalize(&sha, data->data);
    }
}